

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void UnixVfs_TempDir(jx9_context *pCtx)

{
  int iVar1;
  char *pcVar2;
  char *zDir;
  stat buf;
  uint i;
  jx9_context *pCtx_local;
  
  pcVar2 = getenv("TMPDIR");
  if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) || (iVar1 = access(pcVar2,7), iVar1 != 0)) {
    for (buf.__glibc_reserved[2]._4_4_ = 0; buf.__glibc_reserved[2]._4_4_ < 3;
        buf.__glibc_reserved[2]._4_4_ = buf.__glibc_reserved[2]._4_4_ + 1) {
      pcVar2 = UnixVfs_TempDir::azDirs[buf.__glibc_reserved[2]._4_4_];
      if (((pcVar2 != (char *)0x0) && (iVar1 = stat(pcVar2,(stat *)&zDir), iVar1 == 0)) &&
         ((((uint)buf.st_nlink & 0xf000) == 0x4000 && (iVar1 = access(pcVar2,7), iVar1 == 0)))) {
        jx9_result_string(pCtx,pcVar2,-1);
        return;
      }
    }
    jx9_result_string(pCtx,"/tmp",4);
  }
  else {
    jx9_result_string(pCtx,pcVar2,-1);
  }
  return;
}

Assistant:

static void UnixVfs_TempDir(jx9_context *pCtx)
{
	static const char *azDirs[] = {
     "/var/tmp", 
     "/usr/tmp", 
	 "/usr/local/tmp"
  };
  unsigned int i;
  struct stat buf;
  const char *zDir;
  zDir = getenv("TMPDIR");
  if( zDir && zDir[0] != 0 && !access(zDir, 07) ){
	  jx9_result_string(pCtx, zDir, -1);
	  return;
  }
  for(i=0; i<sizeof(azDirs)/sizeof(azDirs[0]); i++){
	zDir=azDirs[i];
    if( zDir==0 ) continue;
    if( stat(zDir, &buf) ) continue;
    if( !S_ISDIR(buf.st_mode) ) continue;
    if( access(zDir, 07) ) continue;
    /* Got one */
	jx9_result_string(pCtx, zDir, -1);
	return;
  }
  /* Default temp dir */
  jx9_result_string(pCtx, "/tmp", (int)sizeof("/tmp")-1);
}